

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O1

void testAttrFloatVectors(string *tempdir)

{
  bool bVar1;
  exr_result_t eVar2;
  exr_context_t p_Var3;
  void *pvVar4;
  float *pfVar5;
  undefined4 *puVar6;
  char *pcVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  char *in_RCX;
  int iVar11;
  float *outp;
  bool bVar12;
  exr_context_t f;
  exr_context_t local_28;
  
  p_Var3 = createDummyFile("<floatvector>");
  local_28 = p_Var3;
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (*p_Var3->report_error)
                      (p_Var3,3,"Invalid reference to float vector object to initialize");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1d0,0x349540,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    eVar2 = (*p_Var3->print_error)
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1d4,0x349540,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (*p_Var3->report_error)(p_Var3,3,"Invalid (NULL) arguments to float vector create");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d7,0x349540,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (*p_Var3->report_error)(p_Var3,3,"Invalid (NULL) arguments to float vector create");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1da,0x349540,in_RCX)
    ;
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    eVar2 = (*p_Var3->print_error)
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1dd,0x349540,in_RCX)
    ;
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    in_RCX = (char *)0x3fffffff;
    eVar2 = (*p_Var3->print_error)(p_Var3,3,"Invalid too large size for float vector (%d entries)");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",(char *)0x1e3,
                   0x349540,in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (*p_Var3->report_error)
                      (p_Var3,3,"Invalid reference to float vector object to initialize");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e6,0x349540,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    eVar2 = (*p_Var3->report_error)
                      (p_Var3,3,"Invalid reference to float array object to initialize");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e9,0x349540,
                   in_RCX);
  }
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    in_RCX = (char *)0xfffffffc;
    eVar2 = (*p_Var3->print_error)
                      (p_Var3,3,
                       "Received request to allocate negative sized float vector (%d entries)");
  }
  if (eVar2 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(3);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1ec,0x349540,
                   in_RCX);
  }
  eVar2 = 0;
  if (p_Var3 == (exr_context_t)0x0) {
    eVar2 = 2;
    bVar1 = false;
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (*p_Var3->alloc_fn)(0x10);
    bVar1 = true;
    if (pvVar4 == (void *)0x0) {
      eVar2 = (*p_Var3->standard_error)(p_Var3,1);
      bVar1 = false;
    }
  }
  if (eVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar7 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1f3,0x349540,in_RCX);
  }
  if (!bVar1) {
    core_test_fail("fv.length == 4",(char *)0x1f4,0x349540,in_RCX);
  }
  if (pvVar4 != (void *)0x0) {
    bVar12 = p_Var3 == (exr_context_t)0x0;
    pcVar7 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar12);
    if ((bool)(!bVar12 & bVar1)) {
      (*p_Var3->free_fn)(pvVar4);
      iVar11 = 0;
    }
    else {
      iVar11 = (uint)bVar12 * 2;
    }
    if (p_Var3 == (exr_context_t)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
      pcVar9 = (char *)exr_get_default_error_message(iVar11);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar10 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      core_test_fail("exr_attr_float_vector_destroy (f, &fv)",(char *)0x1f7,0x349540,pcVar7);
    }
    pfVar5 = (float *)(*p_Var3->alloc_fn)(0x10);
    eVar2 = 0;
    if (pfVar5 == (float *)0x0) {
      eVar2 = (*p_Var3->standard_error)(p_Var3,1);
    }
    if (eVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
      pcVar9 = (char *)exr_get_default_error_message(eVar2);
      if (pcVar9 == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
      }
      else {
        sVar10 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1fc,0x349540,pcVar7
                    );
    }
    pfVar5[0] = 1.0;
    pfVar5[1] = 2.0;
    pfVar5[2] = 3.0;
    pfVar5[3] = 4.0;
    if (pfVar5 == (float *)0x0) {
      core_test_fail("fv.length == 4",(char *)0x1fd,0x349540,pcVar7);
    }
    if ((*pfVar5 != 1.0) || (NAN(*pfVar5))) {
      core_test_fail("fv.arr[0] == 1.f",(char *)0x1ff,0x349540,pcVar7);
    }
    if ((pfVar5[1] != 2.0) || (NAN(pfVar5[1]))) {
      core_test_fail("fv.arr[1] == 2.f",(char *)0x200,0x349540,pcVar7);
    }
    if ((pfVar5[2] != 3.0) || (NAN(pfVar5[2]))) {
      core_test_fail("fv.arr[2] == 3.f",(char *)0x201,0x349540,pcVar7);
    }
    if ((pfVar5[3] != 4.0) || (NAN(pfVar5[3]))) {
      core_test_fail("fv.arr[3] == 4.f",(char *)0x202,0x349540,pcVar7);
    }
    (*p_Var3->free_fn)(pfVar5);
    s_malloc_fail_on = 1;
    puVar6 = (undefined4 *)(*p_Var3->alloc_fn)(0x10);
    eVar2 = 0;
    if (puVar6 == (undefined4 *)0x0) {
      eVar2 = (*p_Var3->standard_error)(p_Var3,1);
    }
    if (eVar2 == 0) {
      *puVar6 = 0x3f800000;
      puVar6[1] = 0x40000000;
      puVar6[2] = 0x40400000;
      puVar6[3] = 0x40800000;
    }
    s_malloc_fail_on = 0;
    if (eVar2 == 1) {
      exr_print_context_info(local_28,0);
      exr_print_context_info(local_28,1);
      exr_finish(&local_28);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar9 = (char *)exr_get_default_error_message(eVar2);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    expected: (",0x10);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") ",2);
    pcVar9 = (char *)exr_get_default_error_message(1);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x206,0x349540,pcVar7);
  }
  core_test_fail("fv.arr != __null",(char *)0x1f6,0x349540,in_RCX);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}